

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

uchar fileExists(char *path,uint pathLength)

{
  int iVar1;
  stat fileInfo;
  stat local_90;
  
  if (path != (char *)0x0) {
    iVar1 = stat(path,&local_90);
    return iVar1 == 0;
  }
  return '\0';
}

Assistant:

unsigned char fileExists(const char * path, unsigned int pathLength)
{
    (void)pathLength;

    if (path == 0)
    {
        return 0;
    }

#ifdef SYSTEM_WINDOWS

    WIN32_FILE_ATTRIBUTE_DATA fileInfo;
    return (GetFileAttributesExA(path, GetFileExInfoStandard, &fileInfo) != 0);

#else

    struct stat fileInfo;
    return (stat(path, &fileInfo) == 0);

#endif
}